

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::WFXMLScanner::scanStartTag(WFXMLScanner *this,bool *gotData)

{
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *this_00;
  ulong uVar1;
  XMLCh *pXVar2;
  XMLDocumentHandler *pXVar3;
  bool bVar4;
  XMLCh XVar5;
  XMLCh *pXVar6;
  unsigned_long *puVar7;
  XMLAttr *pXVar8;
  UnexpectedEOFException *this_01;
  ulong getAt;
  ReaderMgr *this_02;
  XMLSize_t getAt_00;
  byte bVar9;
  bool bFoundSpace;
  XMLCh *local_78;
  XMLSize_t attNameHash;
  DTDElementDecl *local_68;
  XMLSize_t local_60;
  bool *local_58;
  ElemStack *local_50;
  ReaderMgr *local_48;
  XMLBuffer *local_40;
  XMLBuffer *local_38;
  
  *gotData = true;
  this_02 = &(this->super_XMLScanner).fReaderMgr;
  bVar4 = ReaderMgr::getName(this_02,&(this->super_XMLScanner).fQNameBuf);
  if (!bVar4) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    ReaderMgr::skipToChar(this_02,L'<');
    return false;
  }
  local_60 = (this->super_XMLScanner).fElemStack.fStackTop;
  local_78 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  local_78[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  local_68 = (DTDElementDecl *)
             RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::get
                       (this->fElementLookup,local_78);
  if (local_68 == (DTDElementDecl *)0x0) {
    if ((ulong)this->fElementIndex <
        (this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fCurCount) {
      local_68 = (DTDElementDecl *)
                 BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::elementAt
                           (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>,
                            (ulong)this->fElementIndex);
    }
    else {
      local_68 = (DTDElementDecl *)
                 XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      DTDElementDecl::DTDElementDecl(local_68,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::addElement
                (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>,
                 (XMLElementDecl *)local_68);
    }
    XMLElementDecl::setElementName
              (&local_68->super_XMLElementDecl,L"",local_78,
               (this->super_XMLScanner).fEmptyNamespaceId);
    this_00 = this->fElementLookup;
    pXVar6 = XMLElementDecl::getFullName(&local_68->super_XMLElementDecl);
    RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::put
              (this_00,pXVar6,&local_68->super_XMLElementDecl);
    this->fElementIndex = this->fElementIndex + 1;
  }
  local_50 = &(this->super_XMLScanner).fElemStack;
  local_58 = gotData;
  ElemStack::addLevel(local_50,&local_68->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  ReaderMgr::skipPastSpaces(this_02);
  uVar1 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
          fCurCount;
  local_38 = &(this->super_XMLScanner).fAttNameBuf;
  local_40 = &(this->super_XMLScanner).fAttValueBuf;
  getAt = 0;
  local_48 = this_02;
LAB_002bbe42:
  do {
    while( true ) {
      XVar5 = ReaderMgr::peekNextChar(this_02);
      if (((getAt != 0) && (XVar5 != L'/')) && (XVar5 != L'>')) {
        ReaderMgr::skipPastSpaces(this_02,&bFoundSpace,false);
        if (bFoundSpace == false) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
        }
        XVar5 = ReaderMgr::peekNextChar(this_02);
      }
      if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar5] & 0x10)
          == 0) break;
      if ((XVar5 == L'\"') || (XVar5 == L'\'')) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_02);
        ReaderMgr::skipQuotedString(this_02,XVar5);
        ReaderMgr::skipPastSpaces(this_02);
      }
      else {
        if (XVar5 == L'/') {
          ReaderMgr::getNextChar(this_02);
          bVar4 = ReaderMgr::skippedChar(this_02,L'>');
          if (!bVar4) {
            XMLScanner::emitError
                      (&this->super_XMLScanner,UnterminatedStartTag,local_78,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0);
          }
          ElemStack::popTop(local_50);
          bVar9 = 1;
          if (local_60 == 0) {
            *local_58 = false;
          }
LAB_002bc21f:
          pXVar3 = (this->super_XMLScanner).fDocHandler;
          if (pXVar3 != (XMLDocumentHandler *)0x0) {
            (*pXVar3->_vptr_XMLDocumentHandler[0xb])
                      (pXVar3,local_68,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                       (this->super_XMLScanner).fAttrList,getAt,(ulong)bVar9,(ulong)(local_60 == 0))
            ;
            return true;
          }
          return true;
        }
        if (XVar5 == L'<') {
          pXVar6 = XMLElementDecl::getFullName(&local_68->super_XMLElementDecl);
          bVar9 = 0;
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          goto LAB_002bc21f;
        }
        if (XVar5 == L'>') {
          ReaderMgr::getNextChar(this_02);
          bVar9 = 0;
          goto LAB_002bc21f;
        }
        if (XVar5 == L'\0') {
          this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                     ,0x3d8,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    bVar4 = ReaderMgr::getName(this_02,local_38);
    if (!bVar4) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      ReaderMgr::skipPastChar(this_02,L'>');
      return false;
    }
    bVar4 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar4) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
      XVar5 = ReaderMgr::skipUntilInOrWS(this_02,L"\'\"></");
      if ((XVar5 != L'\"') && (XVar5 != L'\'')) {
        if ((XVar5 == L'/') || (XVar5 == L'>')) goto LAB_002bbe42;
        if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                       [(ushort)XVar5]) {
          if (XVar5 != L'<') {
            return false;
          }
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,local_78,(XMLCh *)0x0,(XMLCh *)0x0
                     ,(XMLCh *)0x0);
          return false;
        }
      }
    }
    pXVar6 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
    pXVar6[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
    attNameHash = XMLString::hash(pXVar6,0x6d);
    if (getAt != 0) {
      for (getAt_00 = 0; getAt != getAt_00; getAt_00 = getAt_00 + 1) {
        puVar7 = ValueVectorOf<unsigned_long>::elementAt(this->fAttrNameHashList,getAt_00);
        if (*puVar7 == attNameHash) {
          pXVar8 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                             (&((this->super_XMLScanner).fAttrList)->
                               super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt_00);
          bVar4 = XMLString::equals(pXVar8->fAttName->fLocalPart,pXVar6);
          if (bVar4) {
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar6,local_78,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            break;
          }
        }
      }
    }
    ReaderMgr::skipPastSpaces(this_02);
    bVar4 = scanAttValue(this,pXVar6,local_40);
    if (!bVar4) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      XVar5 = ReaderMgr::skipUntilInOrWS(this_02,L"></");
      if (((XVar5 != L'/') && (XVar5 != L'>')) &&
         (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                     [(ushort)XVar5])) {
        if (XVar5 != L'<') {
          return false;
        }
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,local_78,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
    if (getAt < uVar1) {
      pXVar8 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&((this->super_XMLScanner).fAttrList)->
                           super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar2 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
      pXVar2[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
      XMLAttr::set(pXVar8,0,pXVar6,L"",pXVar2,AttTypes_Min,(DatatypeValidator *)0x0,false);
      pXVar8->fSpecified = true;
      ValueVectorOf<unsigned_long>::setElementAt(this->fAttrNameHashList,&attNameHash,getAt);
    }
    else {
      pXVar8 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      pXVar2 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
      pXVar2[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
      XMLAttr::XMLAttr(pXVar8,0,pXVar6,L"",pXVar2,AttTypes_Min,true,
                       (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,false);
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 pXVar8);
      ValueVectorOf<unsigned_long>::addElement(this->fAttrNameHashList,&attNameHash);
      this_02 = local_48;
    }
    getAt = getAt + 1;
  } while( true );
}

Assistant:

bool WFXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fElementLookup->get(qnameRawBuf);

    if (!elemDecl) {

        if (fElementIndex < fElements->size()) {
            elemDecl = fElements->elementAt(fElementIndex);
        }
        else {
            elemDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
            (
                fGrammarPoolMemoryManager
            );
            fElements->addElement(elemDecl);
        }

        elemDecl->setElementName(XMLUni::fgZeroLenString, qnameRawBuf, fEmptyNamespaceId);
        fElementLookup->put((void*)elemDecl->getFullName(), elemDecl);
        fElementIndex++;
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared more than one for this element.
            const XMLCh* attNameRawBuf = fAttNameBuf.getRawBuffer();
            XMLSize_t attNameHash = XMLString::hash(attNameRawBuf, 109);

            if (attCount) {

                for (XMLSize_t k=0; k < attCount; k++) {

                    if (fAttrNameHashList->elementAt(k) == attNameHash) {
                        if (
                               XMLString::equals
                               (
                                   fAttrList->elementAt(k)->getName()
                                   , attNameRawBuf
                               )
                           )
                        {
                            emitError
                            (
                                XMLErrs::AttrAlreadyUsedInSTag
                                , attNameRawBuf
                                , qnameRawBuf
                            );
                            break;
                        }
                    }
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attNameRawBuf, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                    , XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
                fAttrNameHashList->addElement(attNameHash);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                );
                curAtt->setSpecified(true);
                fAttrNameHashList->setElementAt(attNameHash, attCount);
            }
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}